

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O0

void __thiscall flagser_parameters::~flagser_parameters(flagser_parameters *this)

{
  unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> *in_RDI;
  
  std::unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>::~unique_ptr
            (in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 0x14));
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  std::__cxx11::string::~string((string *)(in_RDI + 0xc));
  std::__cxx11::string::~string((string *)(in_RDI + 8));
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  return;
}

Assistant:

flagser_parameters() { filtration_algorithm.reset(get_filtration_computer("zero")); }